

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas-calc.c
# Opt level: O1

int parse_calculation_line(char *line,char *full_line)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  _Bool _Var5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  borg_calculation *f;
  borg_array *pbVar10;
  char *pcVar11;
  ushort **ppuVar12;
  undefined4 *puVar13;
  long lVar14;
  undefined4 *item;
  size_t sVar15;
  value_sec *p;
  int *item_00;
  ulong uVar16;
  int iVar17;
  char *pos;
  char *pcVar18;
  char buf [1024];
  char *local_458;
  int local_44c;
  char local_438 [1032];
  
  f = (borg_calculation *)mem_zalloc(0x10);
  pbVar10 = (borg_array *)mem_zalloc(0x10);
  f->token_array = pbVar10;
  local_458 = (char *)0x0;
  bVar6 = false;
  bVar7 = false;
  pcVar18 = line;
  iVar9 = 0;
LAB_00224509:
  do {
    if (*pcVar18 == '\0') break;
    _Var5 = prefix_i(pcVar18,"value");
    if (_Var5) {
      pcVar11 = strchr(pcVar18,0x29);
      if (pcVar11 == (char *)0x0) {
        sVar15 = strlen(pcVar18);
        iVar8 = (int)sVar15;
      }
      else {
        iVar8 = ((int)pcVar11 - (int)pcVar18) + 1;
      }
      strncpy(local_438,pcVar18,(long)iVar8);
      local_438[iVar8] = '\0';
      local_458 = string_make(local_438);
    }
    if (!_Var5) {
      cVar2 = *pcVar18;
      if (cVar2 == '!') {
        pcVar18 = pcVar18 + 1;
        bVar6 = true;
        goto LAB_00224509;
      }
      if (cVar2 == '(') {
        iVar8 = iVar9 + 1;
      }
      else {
        if (cVar2 != ')') {
          ppuVar12 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 8) == 0) {
            if (cVar2 == '-') {
              if ((*(byte *)((long)*ppuVar12 + (long)pcVar18[1] * 2 + 1) & 8) != 0)
              goto LAB_002245ca;
              local_44c = 3;
LAB_002247b7:
              bVar4 = true;
              pcVar18 = pcVar18 + 1;
            }
            else {
              if (cVar2 == '*') {
                local_44c = 5;
                goto LAB_002247b7;
              }
              if (cVar2 == '+') {
                local_44c = 4;
                goto LAB_002247b7;
              }
              if (cVar2 == '/') {
                local_44c = 6;
                goto LAB_002247b7;
              }
              _Var5 = prefix_i(pcVar18,"and");
              if (_Var5) {
                pcVar18 = pcVar18 + 3;
LAB_00224873:
                bVar4 = true;
                local_44c = 7;
              }
              else {
                _Var5 = prefix_i(pcVar18,"&&");
                if (_Var5) {
                  pcVar18 = pcVar18 + 2;
                  goto LAB_00224873;
                }
                _Var5 = prefix_i(pcVar18,"or");
                if ((_Var5) || (_Var5 = prefix_i(pcVar18,"||"), _Var5)) {
                  pcVar18 = pcVar18 + 2;
                  bVar4 = true;
                  local_44c = 8;
                }
                else {
                  cVar2 = *pcVar18;
                  if (cVar2 == '<') {
                    pcVar11 = pcVar18 + 1;
                    pcVar1 = pcVar18 + 2;
                    pcVar18 = pcVar18 + 1;
                    if (*pcVar11 == '=') {
                      pcVar18 = pcVar1;
                    }
                    local_44c = (uint)(*pcVar11 == '=') * 2 + 10;
                  }
                  else {
                    if (cVar2 != '>') {
                      if (cVar2 == '=') {
                        pcVar18 = pcVar18 + 1;
                        bVar4 = true;
                        local_44c = 9;
                      }
                      else {
                        bVar4 = false;
                      }
                      goto LAB_002247be;
                    }
                    pcVar11 = pcVar18 + 1;
                    pcVar1 = pcVar18 + 2;
                    pcVar18 = pcVar18 + 1;
                    if (*pcVar11 == '=') {
                      pcVar18 = pcVar1;
                    }
                    local_44c = (uint)(*pcVar11 == '=') * 2 + 0xb;
                  }
                  bVar4 = true;
                }
              }
            }
LAB_002247be:
            if (bVar4) {
              if (f->max_depth < iVar9) {
                f->max_depth = iVar9;
              }
              pbVar10 = f->token_array;
              item_00 = (int *)mem_zalloc(0x18);
              *item_00 = local_44c;
              item_00[2] = 0;
              item_00[3] = 0;
              item_00[4] = iVar9;
              *(undefined1 *)(item_00 + 1) = 0;
              borg_array_add(pbVar10,item_00);
              if (bVar6) {
                borg_formula_error(line,full_line,"calculation",
                                   "** not (!) can only be applied to values");
                bVar7 = true;
              }
            }
            else {
              pcVar18 = pcVar18 + 1;
            }
          }
          else {
LAB_002245ca:
            puVar13 = (undefined4 *)mem_alloc(4);
            lVar14 = atol(pcVar18);
            *puVar13 = (int)lVar14;
            if (f->max_depth < iVar9) {
              f->max_depth = iVar9;
            }
            pbVar10 = f->token_array;
            item = (undefined4 *)mem_zalloc(0x18);
            *item = 2;
            *(undefined4 **)(item + 2) = puVar13;
            item[4] = iVar9;
            *(bool *)(item + 1) = bVar6;
            borg_array_add(pbVar10,item);
            pcVar18 = pcVar18 + -1;
            do {
              do {
                pcVar11 = pcVar18 + 1;
                pcVar18 = pcVar18 + 1;
              } while ((long)*pcVar11 == 0x2d);
            } while (((*ppuVar12)[*pcVar11] & 0x800) != 0);
            bVar6 = false;
          }
          goto LAB_00224509;
        }
        iVar8 = iVar9 + -1;
        if (iVar9 < 1) {
          borg_formula_error(line,full_line,"calculation","** unmatched parenthesis");
          bVar7 = true;
          iVar9 = iVar8;
          break;
        }
      }
      pcVar18 = pcVar18 + 1;
      iVar9 = iVar8;
      goto LAB_00224509;
    }
    sVar15 = strlen(local_458);
    p = parse_value(local_458,full_line);
    if (p == (value_sec *)0x0) {
      bVar7 = true;
    }
    mem_free(local_458);
    if (bVar7) {
      mem_free(p);
    }
    else {
      if (f->max_depth < iVar9) {
        f->max_depth = iVar9;
      }
      pbVar10 = f->token_array;
      puVar13 = (undefined4 *)mem_zalloc(0x18);
      *puVar13 = 1;
      *(value_sec **)(puVar13 + 2) = p;
      puVar13[4] = iVar9;
      *(bool *)(puVar13 + 1) = bVar6;
      borg_array_add(pbVar10,puVar13);
      bVar6 = false;
    }
    pcVar18 = pcVar18 + sVar15;
    local_458 = (char *)0x0;
  } while (!bVar7);
  if ((iVar9 != 0) && (!bVar7)) {
    borg_formula_error(line,full_line,"calculation","** unmatched parenthesis");
    bVar7 = true;
  }
  if (!bVar7) {
    if (-1 < f->max_depth) {
      iVar9 = 0;
      do {
        pbVar10 = f->token_array;
        iVar17 = -1;
        iVar8 = -1;
        if (0 < pbVar10->count) {
          lVar14 = 0;
          do {
            iVar17 = *(int *)((long)pbVar10->items[lVar14] + 0x10);
            if (iVar8 == -1) {
              iVar8 = -1;
              if (iVar17 == iVar9) {
                iVar8 = (int)lVar14;
              }
            }
            else if (iVar17 < iVar9) {
              adjust_order_ops_depth_block(f,iVar9,iVar8,(int)lVar14 + -1);
              iVar8 = -1;
            }
            lVar14 = lVar14 + 1;
            pbVar10 = f->token_array;
          } while (lVar14 < pbVar10->count);
          iVar17 = (int)lVar14 + -1;
        }
        if (iVar8 != -1) {
          adjust_order_ops_depth_block(f,iVar9,iVar8,iVar17);
        }
        bVar7 = iVar9 < f->max_depth;
        iVar9 = iVar9 + 1;
      } while (bVar7);
    }
    pbVar10 = f->token_array;
    uVar3 = pbVar10->count;
    if ((ulong)uVar3 == 0) {
      pcVar18 = "** formula must contain values";
    }
    else {
      if (0 < (int)uVar3) {
        uVar16 = 0;
        pcVar18 = "** formula must be values separated by operators";
        do {
          if (((uVar16 & 1) == 0) == 2 < *pbVar10->items[uVar16]) goto LAB_00224a77;
          uVar16 = uVar16 + 1;
        } while (uVar3 != uVar16);
      }
      if (*pbVar10->items[(long)(int)uVar3 + -1] < 3) {
        iVar9 = borg_array_add(&calculations,f);
        if (iVar9 != -1) {
          return iVar9;
        }
        borg_formula_error(line,full_line,"calculation","** can\'t add to formula array");
        return -1;
      }
      pcVar18 = "** formula can\'t end in an operation";
    }
LAB_00224a77:
    borg_formula_error(line,full_line,"calculation",pcVar18);
  }
  calc_free(f);
  return -1;
}

Assistant:

int parse_calculation_line(char *line, const char *full_line)
{
    struct borg_calculation *f = mem_zalloc(sizeof(struct borg_calculation));
    if (parse_calculation(f, line, full_line)) {
        calc_free(f);
        f = NULL;
        return -1;
    }

    int i = borg_array_add(&calculations, f);
    if (i == -1)
        borg_formula_error(
            line, full_line, "calculation", "** can't add to formula array");
    return i;
}